

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O2

int jpeg_consume_input(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  jpeg_error_mgr *pjVar4;
  jpeg_component_info *pjVar5;
  int iVar6;
  J_COLOR_SPACE JVar7;
  J_COLOR_SPACE JVar8;
  J_COLOR_SPACE JVar9;
  
  iVar6 = cinfo->global_state;
  switch(iVar6) {
  case 200:
    (*cinfo->inputctl->reset_input_controller)(cinfo);
    (*cinfo->src->init_source)(cinfo);
    cinfo->global_state = 0xc9;
switchD_0011b7e2_caseD_c9:
    iVar6 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar6 == 1) {
      iVar6 = cinfo->num_components;
      if (iVar6 == 1) {
        JVar7 = JCS_GRAYSCALE;
        JVar9 = JCS_GRAYSCALE;
      }
      else if (iVar6 == 4) {
        JVar7 = JCS_CMYK;
        JVar9 = JVar7;
        if ((cinfo->saw_Adobe_marker != 0) && (bVar1 = cinfo->Adobe_transform, bVar1 != 0)) {
          if (bVar1 != 2) {
            pjVar4 = cinfo->err;
            pjVar4->msg_code = 0x72;
            (pjVar4->msg_parm).i[0] = (uint)bVar1;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          JVar9 = JCS_YCCK;
        }
      }
      else if (iVar6 == 3) {
        JVar7 = JCS_RGB;
        JVar8 = JCS_YCbCr;
        JVar9 = JVar8;
        if (cinfo->saw_JFIF_marker == 0) {
          if (cinfo->saw_Adobe_marker == 0) {
            pjVar5 = cinfo->comp_info;
            iVar6 = pjVar5->component_id;
            iVar2 = pjVar5[1].component_id;
            iVar3 = pjVar5[2].component_id;
            if ((iVar3 != 3 || (iVar2 != 2 || iVar6 != 1)) &&
               (JVar9 = JVar7, iVar3 != 0x42 || (iVar2 != 0x47 || iVar6 != 0x52))) {
              pjVar4 = cinfo->err;
              (pjVar4->msg_parm).i[0] = iVar6;
              (pjVar4->msg_parm).i[1] = iVar2;
              (pjVar4->msg_parm).i[2] = iVar3;
              pjVar4->msg_code = 0x6f;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,1);
              JVar9 = JVar8;
            }
          }
          else {
            bVar1 = cinfo->Adobe_transform;
            JVar9 = JVar7;
            if ((bVar1 != 0) && (JVar9 = JVar8, bVar1 != 1)) {
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x72;
              (pjVar4->msg_parm).i[0] = (uint)bVar1;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            }
          }
        }
      }
      else {
        JVar7 = JCS_UNKNOWN;
        JVar9 = JCS_UNKNOWN;
      }
      cinfo->jpeg_color_space = JVar9;
      cinfo->out_color_space = JVar7;
      cinfo->scale_num = 1;
      cinfo->scale_denom = 1;
      cinfo->output_gamma = 1.0;
      cinfo->buffered_image = 0;
      cinfo->raw_data_out = 0;
      cinfo->dct_method = JDCT_ISLOW;
      cinfo->do_fancy_upsampling = 1;
      cinfo->do_block_smoothing = 1;
      cinfo->quantize_colors = 0;
      cinfo->dither_mode = JDITHER_FS;
      cinfo->two_pass_quantize = 1;
      cinfo->colormap = (JSAMPARRAY)0x0;
      cinfo->desired_number_of_colors = 0x100;
      cinfo->enable_1pass_quant = 0;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->global_state = 0xca;
switchD_0011b7e2_caseD_ca:
      iVar6 = 1;
    }
    return iVar6;
  case 0xc9:
    goto switchD_0011b7e2_caseD_c9;
  case 0xca:
    goto switchD_0011b7e2_caseD_ca;
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd2:
    iVar6 = (*cinfo->inputctl->consume_input)(cinfo);
    return iVar6;
  default:
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x14;
    (pjVar4->msg_parm).i[0] = iVar6;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    return 0;
  }
}

Assistant:

GLOBAL(int)
jpeg_consume_input(j_decompress_ptr cinfo)
{
  int retcode = JPEG_SUSPENDED;

  /* NB: every possible DSTATE value should be listed in this switch */
  switch (cinfo->global_state) {
  case DSTATE_START:
    /* Start-of-datastream actions: reset appropriate modules */
    (*cinfo->inputctl->reset_input_controller) (cinfo);
    /* Initialize application's data source module */
    (*cinfo->src->init_source) (cinfo);
    cinfo->global_state = DSTATE_INHEADER;
    FALLTHROUGH                 /*FALLTHROUGH*/
  case DSTATE_INHEADER:
    retcode = (*cinfo->inputctl->consume_input) (cinfo);
    if (retcode == JPEG_REACHED_SOS) { /* Found SOS, prepare to decompress */
      /* Set up default parameters based on header data */
      default_decompress_parms(cinfo);
      /* Set global state: ready for start_decompress */
      cinfo->global_state = DSTATE_READY;
    }
    break;
  case DSTATE_READY:
    /* Can't advance past first SOS until start_decompress is called */
    retcode = JPEG_REACHED_SOS;
    break;
  case DSTATE_PRELOAD:
  case DSTATE_PRESCAN:
  case DSTATE_SCANNING:
  case DSTATE_RAW_OK:
  case DSTATE_BUFIMAGE:
  case DSTATE_BUFPOST:
  case DSTATE_STOPPING:
    retcode = (*cinfo->inputctl->consume_input) (cinfo);
    break;
  default:
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  return retcode;
}